

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O0

Value anon_unknown.dwarf_1efbbf::string_to_value(string *val)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  Value local_6c;
  int idx;
  undefined1 local_38 [8];
  string lower;
  string *val_local;
  
  lower.field_2._8_8_ = val;
  std::__cxx11::string::string((string *)local_38,(string *)val);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (__first,__last,__result,tolower);
  local_6c = VALUE_FALSE;
  do {
    if (3 < (int)local_6c) {
      val_local._4_4_ = VALUE_ERROR;
LAB_0021cd49:
      std::__cxx11::string::~string((string *)local_38);
      return val_local._4_4_;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,*(char **)((anonymous_namespace)::VALUE_STRINGS +
                                               (long)(int)local_6c * 8));
    if (bVar1) {
      val_local._4_4_ = local_6c;
      goto LAB_0021cd49;
    }
    local_6c = local_6c + VALUE_TRUE;
  } while( true );
}

Assistant:

inline lsim::Value string_to_value(const std::string &val) {
    // tolower should be ok for our use-case. Including ICU in the project for this seems overly complicated.
    auto lower = val;
    std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

    for (int idx = 0; idx < 4; ++idx) {
        if (lower == VALUE_STRINGS[idx]) {
            return static_cast<lsim::Value>(idx);
        }
    }

    return lsim::VALUE_ERROR;
}